

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem.cpp
# Opt level: O0

bool __thiscall
anon_unknown.dwarf_145302::DirectoryContentsTask::isResultValid
          (DirectoryContentsTask *this,BuildEngine *engine,StringRef path,BuildValue *value)

{
  bool bVar1;
  bool bVar2;
  BuildSystemImpl *this_00;
  FileSystem *pFVar3;
  FileInfo *pFVar4;
  size_type sVar5;
  size_type sVar6;
  reference pSVar7;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *filenames;
  StringRef path_00;
  error_code eVar8;
  bool local_219;
  void *local_1e0;
  size_t local_1d8;
  __normal_iterator<llvm::StringRef_*,_std::vector<llvm::StringRef,_std::allocator<llvm::StringRef>_>_>
  local_1d0;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_1c8;
  __normal_iterator<llvm::StringRef_*,_std::vector<llvm::StringRef,_std::allocator<llvm::StringRef>_>_>
  local_1c0;
  iterator prev_it;
  iterator cur_it;
  undefined1 local_1a8 [8];
  vector<llvm::StringRef,_std::allocator<llvm::StringRef>_> prev;
  error_code ec;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  cur;
  undefined1 local_138 [8];
  FileInfo info;
  BuildValue *value_local;
  BuildEngine *engine_local;
  StringRef path_local;
  void *local_60;
  size_t local_58;
  void **local_50;
  char *local_48;
  size_t local_40;
  size_t local_38;
  char *local_30;
  void *local_28;
  int local_1c;
  reference local_18;
  void **local_10;
  
  info.checksum.bytes._24_8_ = path.Length;
  path_local.Data = path.Data;
  engine_local = engine;
  this_00 = getBuildSystem((BuildEngine *)this);
  pFVar3 = BuildSystemImpl::getFileSystem(this_00);
  llvm::StringRef::operator_cast_to_string
            ((string *)
             &cur.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,(StringRef *)&engine_local);
  (*pFVar3->_vptr_FileSystem[7])
            (local_138,pFVar3,
             &cur.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::__cxx11::string::~string
            ((string *)
             &cur.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  bVar1 = llbuild::basic::FileInfo::isMissing((FileInfo *)local_138);
  if (bVar1) {
    path_local.Length._7_1_ =
         llbuild::buildsystem::BuildValue::isMissingInput((BuildValue *)info.checksum.bytes._24_8_);
  }
  else {
    bVar1 = llbuild::buildsystem::BuildValue::isDirectoryContents
                      ((BuildValue *)info.checksum.bytes._24_8_);
    if (bVar1) {
      bVar1 = llbuild::basic::FileInfo::isDirectory((FileInfo *)local_138);
      pFVar4 = llbuild::buildsystem::BuildValue::getOutputInfo
                         ((BuildValue *)info.checksum.bytes._24_8_);
      bVar2 = llbuild::basic::FileInfo::isDirectory(pFVar4);
      filenames = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)(ulong)bVar2;
      if (bVar1 == bVar2) {
        bVar1 = llbuild::basic::FileInfo::isDirectory((FileInfo *)local_138);
        if (bVar1) {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&ec._M_cat);
          prev.super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)engine_local;
          path_00.Length = (size_t)&ec._M_cat;
          path_00.Data = path_local.Data;
          eVar8 = getContents((DirectoryContentsTask *)engine_local,path_00,filenames);
          ec._0_8_ = eVar8._M_cat;
          llbuild::buildsystem::BuildValue::getDirectoryContents
                    ((vector<llvm::StringRef,_std::allocator<llvm::StringRef>_> *)local_1a8,
                     (BuildValue *)info.checksum.bytes._24_8_);
          sVar5 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)&ec._M_cat);
          sVar6 = std::vector<llvm::StringRef,_std::allocator<llvm::StringRef>_>::size
                            ((vector<llvm::StringRef,_std::allocator<llvm::StringRef>_> *)local_1a8)
          ;
          if (sVar5 == sVar6) {
            prev_it._M_current =
                 (StringRef *)
                 std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)&ec._M_cat);
            local_1c0._M_current =
                 (StringRef *)
                 std::vector<llvm::StringRef,_std::allocator<llvm::StringRef>_>::begin
                           ((vector<llvm::StringRef,_std::allocator<llvm::StringRef>_> *)local_1a8);
            while( true ) {
              local_1c8._M_current =
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)&ec._M_cat);
              bVar1 = __gnu_cxx::operator!=
                                ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                  *)&prev_it,&local_1c8);
              local_219 = false;
              if (bVar1) {
                local_1d0._M_current =
                     (StringRef *)
                     std::vector<llvm::StringRef,_std::allocator<llvm::StringRef>_>::end
                               ((vector<llvm::StringRef,_std::allocator<llvm::StringRef>_> *)
                                local_1a8);
                local_219 = __gnu_cxx::operator!=(&local_1c0,&local_1d0);
              }
              if (local_219 == false) {
                path_local.Length._7_1_ = 1;
                goto LAB_001a8c53;
              }
              local_18 = __gnu_cxx::
                         __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         ::operator*((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                      *)&prev_it);
              local_10 = &local_1e0;
              local_1e0 = (void *)std::__cxx11::string::data();
              local_1d8 = std::__cxx11::string::length();
              pSVar7 = __gnu_cxx::
                       __normal_iterator<llvm::StringRef_*,_std::vector<llvm::StringRef,_std::allocator<llvm::StringRef>_>_>
                       ::operator*(&local_1c0);
              local_48 = pSVar7->Data;
              local_40 = pSVar7->Length;
              local_60 = local_1e0;
              local_58 = local_1d8;
              local_50 = &local_60;
              bVar1 = false;
              if (local_1d8 == local_40) {
                local_28 = local_1e0;
                local_38 = local_40;
                local_30 = local_48;
                if (local_40 == 0) {
                  local_1c = 0;
                }
                else {
                  local_1c = memcmp(local_1e0,local_48,local_40);
                }
                bVar1 = local_1c == 0;
              }
              if (!bVar1) break;
              __gnu_cxx::
              __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator++((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)&prev_it,0);
              __gnu_cxx::
              __normal_iterator<llvm::StringRef_*,_std::vector<llvm::StringRef,_std::allocator<llvm::StringRef>_>_>
              ::operator++(&local_1c0,0);
            }
            path_local.Length._7_1_ = 0;
          }
          else {
            path_local.Length._7_1_ = 0;
          }
LAB_001a8c53:
          std::vector<llvm::StringRef,_std::allocator<llvm::StringRef>_>::~vector
                    ((vector<llvm::StringRef,_std::allocator<llvm::StringRef>_> *)local_1a8);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&ec._M_cat);
        }
        else {
          pFVar4 = llbuild::buildsystem::BuildValue::getOutputInfo
                             ((BuildValue *)info.checksum.bytes._24_8_);
          path_local.Length._7_1_ =
               llbuild::basic::FileInfo::operator==(pFVar4,(FileInfo *)local_138);
        }
      }
      else {
        path_local.Length._7_1_ = 0;
      }
    }
    else {
      path_local.Length._7_1_ = 0;
    }
  }
  return (bool)(path_local.Length._7_1_ & 1);
}

Assistant:

static bool isResultValid(BuildEngine& engine, StringRef path,
                            const BuildValue& value) {
    // The result is valid if the existence matches the existing value type, and
    // the file information remains the same.
    auto info = getBuildSystem(engine).getFileSystem().getFileInfo(
        path);
    if (info.isMissing()) {
      return value.isMissingInput();
    } else {
      if (!value.isDirectoryContents())
        return false;

      // If the type changes rebuild
      if (info.isDirectory() != value.getOutputInfo().isDirectory())
        return false;

      // For files, it is direct stat info that matters
      if (!info.isDirectory())
        return value.getOutputInfo() == info;

      // With filters, we list the current filtered contents and then compare
      // the lists.
      std::vector<std::string> cur;
      std::error_code ec = getContents(path, cur);

      // Currently, tests and presumably clients expect that errors are silently
      // ignored when reading directory contents listings.
      (void)ec;

      auto prev = value.getDirectoryContents();

      if (cur.size() != prev.size())
        return false;

      auto cur_it = cur.begin();
      auto prev_it = prev.begin();
      for (; cur_it != cur.end() && prev_it != prev.end(); cur_it++, prev_it++) {
        if (*cur_it != *prev_it) {
          return false;
        }
      }

      return true;
    }
  }